

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::XmlUnitTestResultPrinter::XmlUnitTestResultPrinter
          (XmlUnitTestResultPrinter *this,char *output_file)

{
  bool bVar1;
  FILE *__stream;
  undefined8 extraout_RAX;
  String *this_00;
  size_t *this_01;
  FilePath FStack_40;
  FilePath FStack_30;
  XmlUnitTestResultPrinter *pXStack_20;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__XmlUnitTestResultPrinter_00139728;
  this_00 = &this->output_file_;
  String::String(this_00,output_file);
  if (((this->output_file_).c_str_ != (char *)0x0) && ((this->output_file_).length_ != 0)) {
    return;
  }
  internal::XmlUnitTestResultPrinter();
  this_01 = &this_00->length_;
  pXStack_20 = this;
  FilePath::FilePath(&FStack_30,(String *)this_01);
  FilePath::RemoveFileName(&FStack_40);
  bVar1 = FilePath::CreateDirectoriesRecursively(&FStack_40);
  if (bVar1) {
    __stream = fopen((char *)*this_01,"w");
  }
  else {
    __stream = (FILE *)0x0;
  }
  if (__stream != (FILE *)0x0) {
    PrintXmlUnitTest((FILE *)__stream,(UnitTest *)output_file);
    fclose(__stream);
    if (FStack_40.pathname_.c_str_ != (char *)0x0) {
      operator_delete__(FStack_40.pathname_.c_str_);
    }
    if (FStack_30.pathname_.c_str_ != (char *)0x0) {
      operator_delete__(FStack_30.pathname_.c_str_);
    }
    return;
  }
  OnTestIterationEnd((XmlUnitTestResultPrinter *)this_01);
  if (FStack_30.pathname_.c_str_ != (char *)0x0) {
    operator_delete__(FStack_30.pathname_.c_str_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

XmlUnitTestResultPrinter::XmlUnitTestResultPrinter(const char* output_file)
    : output_file_(output_file) {
  if (output_file_.c_str() == NULL || output_file_.empty()) {
    fprintf(stderr, "XML output file may not be null\n");
    fflush(stderr);
    exit(EXIT_FAILURE);
  }
}